

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O1

void __thiscall xercesc_4_0::DGXMLScanner::scanCharData(DGXMLScanner *this,XMLBuffer *toUse)

{
  XMLCh XVar1;
  XMLReader *pXVar2;
  XMLCh *toCheck;
  XMLCh XVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  XMLSize_t XVar8;
  StackElem *pSVar9;
  XMLSize_t XVar10;
  XMLSize_t count;
  bool escaped;
  XMLCh nextCh;
  XMLCh secondCh;
  XMLCh tmpBuf [9];
  char local_5f;
  XMLCh local_5e;
  bool local_5b;
  XMLCh local_5a;
  XMLBuffer *local_58;
  undefined4 local_4c;
  XMLCh local_48 [12];
  
  toUse->fIndex = 0;
  local_5b = (this->super_XMLScanner).fReaderMgr.fThrowEOE;
  (this->super_XMLScanner).fReaderMgr.fThrowEOE = true;
  local_5a = L'\0';
  local_5f = '\0';
  bVar5 = false;
  local_4c = (undefined4)CONCAT71((int7)((ulong)&local_5f >> 8),1);
  local_58 = toUse;
  iVar7 = 0;
LAB_002a1cee:
  if ((iVar7 == 0) && (!bVar5)) {
    pXVar2 = (this->super_XMLScanner).fReaderMgr.fCurReader;
    XVar8 = pXVar2->fCharsAvail - pXVar2->fCharIndex;
    if (XVar8 == 0) {
      count = 0;
    }
    else {
      XVar10 = 0;
      do {
        count = XVar10;
        if ((pXVar2->fgCharCharsTable[(ushort)(pXVar2->fCharBuf + pXVar2->fCharIndex)[XVar10]] & 8)
            == 0) break;
        XVar10 = XVar10 + 1;
        count = XVar8;
      } while (XVar8 != XVar10);
    }
    if (count != 0) {
      XMLBuffer::append(local_58,pXVar2->fCharBuf + pXVar2->fCharIndex,count);
      pXVar2->fCharIndex = pXVar2->fCharIndex + count;
      pXVar2->fCurCol = pXVar2->fCurCol + count;
    }
  }
  pXVar2 = (this->super_XMLScanner).fReaderMgr.fCurReader;
  if ((pXVar2->fCharIndex < pXVar2->fCharsAvail) ||
     ((pXVar2->fNoMore == false && (bVar4 = XMLReader::refreshCharBuffer(pXVar2), bVar4)))) {
    XVar1 = pXVar2->fCharBuf[pXVar2->fCharIndex];
    if (XVar1 != L'<') {
      pXVar2->fCharIndex = pXVar2->fCharIndex + 1;
      local_5e = XVar1;
      if ((XVar1 & 0xdf50U) == 0) {
        XMLReader::handleEOL(pXVar2,&local_5e,false);
      }
      else {
        pXVar2->fCurCol = pXVar2->fCurCol + 1;
      }
      local_5f = '\0';
      if (local_5e == L'&') goto code_r0x002a1de5;
      if ((local_5e & 0xfc00U) == 0xdc00) {
        if (!bVar5) {
          XMLScanner::emitError(&this->super_XMLScanner,Unexpected2ndSurrogateChar);
        }
LAB_002a1f0f:
        bVar4 = false;
      }
      else {
        if ((local_5e & 0xfc00U) != 0xd800) {
          if (bVar5) {
            XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
          }
          if ((((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable[(ushort)local_5e]
              & 0x40) == 0) {
            XMLString::binToText
                      ((uint)(ushort)local_5e,local_48,8,0x10,
                       (this->super_XMLScanner).fMemoryManager);
            XMLScanner::emitError
                      (&this->super_XMLScanner,InvalidCharacter,local_48,(XMLCh *)0x0,(XMLCh *)0x0,
                       (XMLCh *)0x0);
          }
          goto LAB_002a1f0f;
        }
        bVar4 = true;
        if (bVar5) {
          XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
          bVar4 = bVar5;
        }
      }
      goto LAB_002a1f11;
    }
  }
  if (bVar5) {
    XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
  }
  if (((this->super_XMLScanner).fValidate == true) && ((this->super_XMLScanner).fStandalone == true)
     ) {
    XVar8 = local_58->fIndex;
    toCheck = local_58->fBuffer;
    toCheck[XVar8] = L'\0';
    bVar5 = XMLReader::containsWhiteSpace
                      ((this->super_XMLScanner).fReaderMgr.fCurReader,toCheck,XVar8);
    if (bVar5) {
      pSVar9 = ElemStack::topElement(&(this->super_XMLScanner).fElemStack);
      if ((pSVar9->fThisElement->fExternalElement == true) &&
         (iVar7 = (*(pSVar9->fThisElement->super_XSerializable)._vptr_XSerializable[6])(),
         iVar7 == 1)) {
        XMLValidator::emitError((this->super_XMLScanner).fValidator,NoWSForStandalone);
      }
    }
  }
  (*(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler[0x10])
            (this,local_58);
  (this->super_XMLScanner).fReaderMgr.fThrowEOE = local_5b;
  return;
code_r0x002a1de5:
  (*(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler[0x10])
            (this,local_58);
  bVar4 = (this->super_XMLScanner).fReaderMgr.fThrowEOE;
  (this->super_XMLScanner).fReaderMgr.fThrowEOE = false;
  iVar6 = (*(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler[0xd])
                    (this,0,&local_5e,&local_5a,&local_5f);
  if (iVar6 == 1) {
    if ((local_5f == '\x01') && (XVar8 = (this->super_XMLScanner).fElemStack.fStackTop, XVar8 != 0))
    {
      (this->super_XMLScanner).fElemStack.fStack[XVar8 - 1]->fReferenceEscaped = true;
    }
  }
  else {
    bVar5 = false;
  }
  (this->super_XMLScanner).fReaderMgr.fThrowEOE = bVar4;
  bVar4 = bVar5;
  if (iVar6 == 1) {
LAB_002a1f11:
    bVar5 = bVar4;
    iVar6 = 0;
    if (local_5f == '\0') {
      if (local_5e == L'>') {
        if (iVar7 == 2) {
          XMLScanner::emitError(&this->super_XMLScanner,BadSequenceInCharData);
        }
      }
      else if (local_5e == L']') {
        if (iVar7 == 0) {
          iVar6 = 1;
        }
        else {
          iVar6 = iVar7;
          if (iVar7 == 1) {
            iVar6 = 2;
          }
        }
      }
    }
    XVar1 = local_5e;
    if (local_58->fIndex == local_58->fCapacity) {
      XMLBuffer::ensureCapacity(local_58,1);
    }
    XVar3 = local_5a;
    XVar10 = local_58->fIndex;
    XVar8 = XVar10 + 1;
    local_58->fIndex = XVar8;
    local_58->fBuffer[XVar10] = XVar1;
    iVar7 = iVar6;
    if (local_5a != L'\0') {
      if (XVar8 == local_58->fCapacity) {
        XMLBuffer::ensureCapacity(local_58,1);
      }
      XVar8 = local_58->fIndex;
      local_58->fIndex = XVar8 + 1;
      local_58->fBuffer[XVar8] = XVar3;
      local_5a = L'\0';
    }
  }
  goto LAB_002a1cee;
}

Assistant:

void DGXMLScanner::scanCharData(XMLBuffer& toUse)
{
    //  We have to watch for the stupid ]]> sequence, which is illegal in
    //  character data. So this is a little state machine that handles that.
    enum States
    {
        State_Waiting
        , State_GotOne
        , State_GotTwo
    };

    // Reset the buffer before we start
    toUse.reset();

    // Turn on the 'throw at end' flag of the reader manager
    ThrowEOEJanitor jan(&fReaderMgr, true);

    //  In order to be more efficient we have to use kind of a deeply nested
    //  set of blocks here. The outer block puts on a try and catches end of
    //  entity exceptions. The inner loop is the per-character loop. If we
    //  put the try inside the inner loop, it would work but would require
    //  the exception handling code setup/teardown code to be invoked for
    //  each character.
    XMLCh   nextCh;
    XMLCh   secondCh = 0;
    States  curState = State_Waiting;
    bool    escaped = false;
    bool    gotLeadingSurrogate = false;
    bool    notDone = true;
    while (notDone)
    {
        try
        {
            while (true)
            {
                //  Eat through as many plain content characters as possible without
                //  needing special handling.  Moving most content characters here,
                //  in this one call, rather than running the overall loop once
                //  per content character, is a speed optimization.
                if (curState == State_Waiting  &&  !gotLeadingSurrogate)
                {
                     fReaderMgr.movePlainContentChars(toUse);
                }

                // Try to get another char from the source
                //   The code from here on down covers all contengencies,
                if (!fReaderMgr.getNextCharIfNot(chOpenAngle, nextCh))
                {
                    // If we were waiting for a trailing surrogate, its an error
                    if (gotLeadingSurrogate)
                        emitError(XMLErrs::Expected2ndSurrogateChar);

                    notDone = false;
                    break;
                }

                //  Watch for a reference. Note that the escapement mechanism
                //  is ignored in this content.
                escaped = false;
                if (nextCh == chAmpersand)
                {
                    sendCharData(toUse);

                    // Turn off the throwing at the end of entity during this
                    ThrowEOEJanitor jan(&fReaderMgr, false);

                    if (scanEntityRef(false, nextCh, secondCh, escaped) != EntityExp_Returned)
                    {
                        gotLeadingSurrogate = false;
                        continue;
                    }
                    else
                    {
                        if (escaped && !fElemStack.isEmpty())
                            fElemStack.setReferenceEscaped();
                    }
                }
                else if ((nextCh >= 0xD800) && (nextCh <= 0xDBFF))
                {
                    // Deal with surrogate pairs
                    //  Its a leading surrogate. If we already got one, then
                    //  issue an error, else set leading flag to make sure that
                    //  we look for a trailing next time.
                    if (gotLeadingSurrogate)
                        emitError(XMLErrs::Expected2ndSurrogateChar);
                    else
                        gotLeadingSurrogate = true;
                }
                else
                {
                    //  If its a trailing surrogate, make sure that we are
                    //  prepared for that. Else, its just a regular char so make
                    //  sure that we were not expected a trailing surrogate.
                    if ((nextCh >= 0xDC00) && (nextCh <= 0xDFFF))
                    {
                        // Its trailing, so make sure we were expecting it
                        if (!gotLeadingSurrogate)
                            emitError(XMLErrs::Unexpected2ndSurrogateChar);
                    }
                    else
                    {
                        //  Its just a char, so make sure we were not expecting a
                        //  trailing surrogate.
                        if (gotLeadingSurrogate)
                            emitError(XMLErrs::Expected2ndSurrogateChar);

                        // Make sure the returned char is a valid XML char
                        if (!fReaderMgr.getCurrentReader()->isXMLChar(nextCh))
                        {
                            XMLCh tmpBuf[9];
                            XMLString::binToText
                            (
                                nextCh
                                , tmpBuf
                                , 8
                                , 16
                                , fMemoryManager
                            );
                            emitError(XMLErrs::InvalidCharacter, tmpBuf);
                        }
                    }
                    gotLeadingSurrogate = false;
                }

                 // Keep the state machine up to date
                if (!escaped)
                {
                    if (nextCh == chCloseSquare)
                    {
                        if (curState == State_Waiting)
                            curState = State_GotOne;
                        else if (curState == State_GotOne)
                            curState = State_GotTwo;
                    }
                    else if (nextCh == chCloseAngle)
                    {
                        if (curState == State_GotTwo)
                            emitError(XMLErrs::BadSequenceInCharData);
                        curState = State_Waiting;
                    }
                    else
                    {
                        curState = State_Waiting;
                    }
                }
                else
                {
                    curState = State_Waiting;
                }

                // Add this char to the buffer
                toUse.append(nextCh);

                if (secondCh)
                {
                    toUse.append(secondCh);
                    secondCh=0;
                }
            }
        }
        catch(const EndOfEntityException& toCatch)
        {
            //  Some entity ended, so we have to send any accumulated
            //  chars and send an end of entity event.
            sendCharData(toUse);
            gotLeadingSurrogate = false;

            if (fDocHandler)
                fDocHandler->endEntityReference(toCatch.getEntity());
        }
    }

    // Check the validity constraints as per XML 1.0 Section 2.9
    if (fValidate && fStandalone)
    {
        // See if the text contains whitespace
        // Get the raw data we need for the callback
        const XMLCh* rawBuf = toUse.getRawBuffer();
        const XMLSize_t len = toUse.getLen();
        const bool isSpaces = fReaderMgr.getCurrentReader()->containsWhiteSpace(rawBuf, len);

        if (isSpaces)
        {
            // And see if the current element is a 'Children' style content model
            const ElemStack::StackElem* topElem = fElemStack.topElement();

            if (topElem->fThisElement->isExternal()) {

                // Get the character data opts for the current element
                XMLElementDecl::CharDataOpts charOpts =  topElem->fThisElement->getCharDataOpts();

                if (charOpts == XMLElementDecl::SpacesOk)  // => Element Content
                {
                    // Error - standalone should have a value of "no" as whitespace detected in an
                    // element type with element content whose element declaration was external
                    //
                    fValidator->emitError(XMLValid::NoWSForStandalone);
                }
            }
        }
    }
    // Send any char data that we accumulated into the buffer
    sendCharData(toUse);
}